

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

ListNode * list_add_value(ListNode *head,void *value,int refcount)

{
  ListNode *pLVar1;
  
  pLVar1 = (ListNode *)malloc(0x20);
  if (head == (ListNode *)0x0) {
    cm_print_error("%s\n","head");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x264);
  }
  if (value != (void *)0x0) {
    pLVar1->value = value;
    pLVar1->refcount = refcount;
    pLVar1 = list_add(head,pLVar1);
    return pLVar1;
  }
  cm_print_error("%s\n","value");
  _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
        ,0x265);
}

Assistant:

static ListNode* list_add_value(ListNode * const head, const void *value,
                                     const int refcount) {
    ListNode * const new_node = (ListNode*)malloc(sizeof(ListNode));
    assert_non_null(head);
    assert_non_null(value);
    new_node->value = value;
    new_node->refcount = refcount;
    return list_add(head, new_node);
}